

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
mjs::function_base::function_base
          (function_base *this,source_extend *body_extend,wstring *id,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *params,statement_ptr *block)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pwVar2;
  statement *psVar3;
  block_statement *__p;
  uint32_t uVar4;
  int iVar5;
  
  (this->body_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (body_extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var1 = (body_extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->body_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar4 = body_extend->end;
  (this->body_extend_).start = body_extend->start;
  (this->body_extend_).end = uVar4;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  pwVar2 = (id->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->id_,pwVar2,pwVar2 + id->_M_string_length);
  (this->params_).
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (params->
       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->params_).
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (params->
       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->params_).
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (params->
       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (params->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (params->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (params->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block_).super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->block_).super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar3 = (block->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
           ._M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar3 != (statement *)0x0) {
    iVar5 = (**(code **)((long)(psVar3->super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar5 == 0) {
      __p = (block_statement *)
            (block->_M_t).
            super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
            super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
            super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      (block->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t
      .super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
      std::__shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>::
      reset<mjs::block_statement>
                (&(this->block_).
                  super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>,__p);
      return;
    }
  }
  __assert_fail("block && block->type() == statement_type::block",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x81,
                "mjs::function_base::function_base(const source_extend &, const std::wstring &, std::vector<std::wstring> &&, statement_ptr &&)"
               );
}

Assistant:

function_base::function_base(const source_extend& body_extend, const std::wstring& id, std::vector<std::wstring>&& params, statement_ptr&& block) : body_extend_(body_extend), id_(id), params_(std::move(params)) {
    assert(block && block->type() == statement_type::block);
    block_.reset(static_cast<block_statement*>(block.release()));
}